

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

bool GenerateBlock(ChainstateManager *chainman,Mining *miner,CBlock *block,uint64_t *max_tries,
                  shared_ptr<const_CBlock> *block_out,bool process_new_block)

{
  uint32_t *puVar1;
  uint256 hash;
  bool bVar2;
  int iVar3;
  UniValue *__return_storage_ptr__;
  uint64_t uVar4;
  long in_FS_OFFSET;
  allocator<char> local_79;
  uint256 local_78;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::reset
            (&block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
  BlockMerkleRoot((uint256 *)local_58,block,(bool *)0x0);
  *(size_type *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_48._M_allocated_capacity;
  *(undefined8 *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_48._8_8_;
  *(undefined1 (*) [8])
   (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems = local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
       _Stack_50._M_pi;
  uVar4 = *max_tries;
  while( true ) {
    if ((uVar4 == 0) || ((block->super_CBlockHeader).nNonce == 0xffffffff)) goto LAB_002ca397;
    CBlockHeader::GetHash(&local_78,&block->super_CBlockHeader);
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_78.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_78.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_78.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_78.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_78.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_78.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_78.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_78.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_78.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_78.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_78.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_78.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_78.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_78.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_78.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_78.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x10];
    hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x11];
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x12];
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x13];
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x14];
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x15];
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x16];
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x17];
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x18];
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x19];
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_78.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar2 = CheckProofOfWork(hash,(block->super_CBlockHeader).nBits,
                             &((chainman->m_options).chainparams)->consensus);
    if (bVar2) break;
    bVar2 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
    uVar4 = *max_tries;
    if (bVar2) goto LAB_002ca397;
    puVar1 = &(block->super_CBlockHeader).nNonce;
    *puVar1 = *puVar1 + 1;
    uVar4 = uVar4 - 1;
    *max_tries = uVar4;
  }
  uVar4 = *max_tries;
LAB_002ca397:
  if (uVar4 == 0) {
LAB_002ca3ad:
    bVar2 = false;
  }
  else {
    bVar2 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
    if (bVar2) goto LAB_002ca3ad;
    bVar2 = true;
    if ((block->super_CBlockHeader).nNonce != 0xffffffff) {
      std::make_shared<CBlock_const,CBlock>((CBlock *)local_58);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
      if (process_new_block) {
        iVar3 = (*miner->_vptr_Mining[7])(miner,block_out,0);
        if ((char)iVar3 == '\0') {
          __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_58,"ProcessNewBlock, block not accepted",&local_79);
          JSONRPCError(__return_storage_ptr__,-0x7f5b,(string *)local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_002ca4bb;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_002ca4bb:
  __stack_chk_fail();
}

Assistant:

static bool GenerateBlock(ChainstateManager& chainman, Mining& miner, CBlock&& block, uint64_t& max_tries, std::shared_ptr<const CBlock>& block_out, bool process_new_block)
{
    block_out.reset();
    block.hashMerkleRoot = BlockMerkleRoot(block);

    while (max_tries > 0 && block.nNonce < std::numeric_limits<uint32_t>::max() && !CheckProofOfWork(block.GetHash(), block.nBits, chainman.GetConsensus()) && !chainman.m_interrupt) {
        ++block.nNonce;
        --max_tries;
    }
    if (max_tries == 0 || chainman.m_interrupt) {
        return false;
    }
    if (block.nNonce == std::numeric_limits<uint32_t>::max()) {
        return true;
    }

    block_out = std::make_shared<const CBlock>(std::move(block));

    if (!process_new_block) return true;

    if (!miner.processNewBlock(block_out, nullptr)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "ProcessNewBlock, block not accepted");
    }

    return true;
}